

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O3

void test_cpp_wrapper_equality_duplicates(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key)

{
  long lVar1;
  int *expected_values;
  ulong uVar2;
  int value;
  undefined8 uStack_50;
  int aiStack_48 [2];
  ulong local_40;
  int *local_38;
  
  lVar1 = -((ulong)(uint)key * 4 + 0xf & 0xfffffffffffffff0);
  local_38 = (int *)((long)aiStack_48 + lVar1);
  if (0 < key) {
    value = 2;
    uVar2 = 0;
    local_40 = (ulong)(uint)key;
    do {
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x104d18;
      cpp_wrapper_insert(tc,dict,key,value,'\0');
      local_38[uVar2] = value;
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x104d34;
      cpp_wrapper_insert(tc,dict,(int)uVar2,value + -2,'\0');
      value = value + 2;
      uVar2 = uVar2 + 1;
    } while (local_40 != uVar2);
  }
  expected_values = local_38;
  *(undefined8 *)((long)&uStack_50 + lVar1) = 0x104d5f;
  cpp_wrapper_equality(tc,dict,key,expected_values,key,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_equality_duplicates(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key
) {
	int values[key];

	for (int i = 1; i <= key; i++) {
		cpp_wrapper_insert(tc, dict, key, i * 2, boolean_false);
		values[i - 1] = i * 2;

		cpp_wrapper_insert(tc, dict, i - 1, (i - 1) * 2, boolean_false);
	}

	cpp_wrapper_equality(tc, dict, key, values, key, boolean_true);
}